

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256_32.c
# Opt level: O3

void areduction(uint64_t *n,uint64_t nInv,uint64_t *c,uint64_t *res)

{
  ulong *puVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  ulong uVar193;
  ulong uVar194;
  ulong uVar195;
  long lVar196;
  ulong uVar197;
  ulong uVar198;
  ulong uVar199;
  long lVar200;
  long lVar201;
  uint64_t out0;
  bool bVar202;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  uint64_t tmp [64];
  uint64_t local_228 [64];
  
  lVar200 = 0;
  bVar202 = false;
  do {
    uVar2 = c[lVar200];
    uVar199 = uVar2 * nInv;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar199;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = *n;
    uVar197 = SUB168(auVar3 * auVar67,8);
    uVar193 = SUB168(auVar3 * auVar67,0);
    c[lVar200] = uVar193 + uVar2;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar199;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = n[1];
    uVar194 = SUB168(auVar4 * auVar68,0);
    uVar193 = (ulong)CARRY8(uVar193,uVar2);
    uVar198 = uVar194 + uVar197;
    uVar195 = uVar198 + uVar193;
    puVar1 = c + lVar200 + 1;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar195;
    auVar131._8_8_ = 0;
    auVar131._0_8_ =
         SUB168(auVar4 * auVar68,8) + (ulong)(CARRY8(uVar194,uVar197) || CARRY8(uVar198,uVar193)) +
         (ulong)CARRY8(uVar2,uVar195);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar199;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = n[2];
    auVar131 = auVar5 * auVar69 + auVar131;
    uVar193 = auVar131._0_8_;
    puVar1 = c + lVar200 + 2;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar132._8_8_ = 0;
    auVar132._0_8_ = auVar131._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar199;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = n[3];
    auVar132 = auVar6 * auVar70 + auVar132;
    uVar193 = auVar132._0_8_;
    puVar1 = c + lVar200 + 3;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = auVar132._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar199;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = n[4];
    auVar133 = auVar7 * auVar71 + auVar133;
    uVar193 = auVar133._0_8_;
    puVar1 = c + lVar200 + 4;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = auVar133._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar199;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = n[5];
    auVar134 = auVar8 * auVar72 + auVar134;
    uVar193 = auVar134._0_8_;
    puVar1 = c + lVar200 + 5;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = auVar134._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar199;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = n[6];
    auVar135 = auVar9 * auVar73 + auVar135;
    uVar193 = auVar135._0_8_;
    puVar1 = c + lVar200 + 6;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar136._8_8_ = 0;
    auVar136._0_8_ = auVar135._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar199;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = n[7];
    auVar136 = auVar10 * auVar74 + auVar136;
    uVar193 = auVar136._0_8_;
    puVar1 = c + lVar200 + 7;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = auVar136._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar199;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = n[8];
    auVar137 = auVar11 * auVar75 + auVar137;
    uVar193 = auVar137._0_8_;
    puVar1 = c + lVar200 + 8;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = auVar137._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar199;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = n[9];
    auVar138 = auVar12 * auVar76 + auVar138;
    uVar193 = auVar138._0_8_;
    puVar1 = c + lVar200 + 9;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar139._8_8_ = 0;
    auVar139._0_8_ = auVar138._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar199;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = n[10];
    auVar139 = auVar13 * auVar77 + auVar139;
    uVar193 = auVar139._0_8_;
    puVar1 = c + lVar200 + 10;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar140._8_8_ = 0;
    auVar140._0_8_ = auVar139._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar199;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = n[0xb];
    auVar140 = auVar14 * auVar78 + auVar140;
    uVar193 = auVar140._0_8_;
    puVar1 = c + lVar200 + 0xb;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar141._8_8_ = 0;
    auVar141._0_8_ = auVar140._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar199;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = n[0xc];
    auVar141 = auVar15 * auVar79 + auVar141;
    uVar193 = auVar141._0_8_;
    puVar1 = c + lVar200 + 0xc;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar142._8_8_ = 0;
    auVar142._0_8_ = auVar141._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar199;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = n[0xd];
    auVar142 = auVar16 * auVar80 + auVar142;
    uVar193 = auVar142._0_8_;
    puVar1 = c + lVar200 + 0xd;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar143._8_8_ = 0;
    auVar143._0_8_ = auVar142._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar199;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = n[0xe];
    auVar143 = auVar17 * auVar81 + auVar143;
    uVar193 = auVar143._0_8_;
    puVar1 = c + lVar200 + 0xe;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar144._8_8_ = 0;
    auVar144._0_8_ = auVar143._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar199;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = n[0xf];
    auVar144 = auVar18 * auVar82 + auVar144;
    uVar193 = auVar144._0_8_;
    puVar1 = c + lVar200 + 0xf;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar145._8_8_ = 0;
    auVar145._0_8_ = auVar144._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar199;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = n[0x10];
    auVar145 = auVar19 * auVar83 + auVar145;
    uVar193 = auVar145._0_8_;
    puVar1 = c + lVar200 + 0x10;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar146._8_8_ = 0;
    auVar146._0_8_ = auVar145._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar199;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = n[0x11];
    auVar146 = auVar20 * auVar84 + auVar146;
    uVar193 = auVar146._0_8_;
    puVar1 = c + lVar200 + 0x11;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar147._8_8_ = 0;
    auVar147._0_8_ = auVar146._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar199;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = n[0x12];
    auVar147 = auVar21 * auVar85 + auVar147;
    uVar193 = auVar147._0_8_;
    puVar1 = c + lVar200 + 0x12;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar148._8_8_ = 0;
    auVar148._0_8_ = auVar147._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar199;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = n[0x13];
    auVar148 = auVar22 * auVar86 + auVar148;
    uVar193 = auVar148._0_8_;
    puVar1 = c + lVar200 + 0x13;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar149._8_8_ = 0;
    auVar149._0_8_ = auVar148._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar199;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = n[0x14];
    auVar149 = auVar23 * auVar87 + auVar149;
    uVar193 = auVar149._0_8_;
    puVar1 = c + lVar200 + 0x14;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar150._8_8_ = 0;
    auVar150._0_8_ = auVar149._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar199;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = n[0x15];
    auVar150 = auVar24 * auVar88 + auVar150;
    uVar193 = auVar150._0_8_;
    puVar1 = c + lVar200 + 0x15;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar151._8_8_ = 0;
    auVar151._0_8_ = auVar150._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar199;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = n[0x16];
    auVar151 = auVar25 * auVar89 + auVar151;
    uVar193 = auVar151._0_8_;
    puVar1 = c + lVar200 + 0x16;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar152._8_8_ = 0;
    auVar152._0_8_ = auVar151._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar199;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = n[0x17];
    auVar152 = auVar26 * auVar90 + auVar152;
    uVar193 = auVar152._0_8_;
    puVar1 = c + lVar200 + 0x17;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar153._8_8_ = 0;
    auVar153._0_8_ = auVar152._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar199;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = n[0x18];
    auVar153 = auVar27 * auVar91 + auVar153;
    uVar193 = auVar153._0_8_;
    puVar1 = c + lVar200 + 0x18;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = auVar153._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar199;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = n[0x19];
    auVar154 = auVar28 * auVar92 + auVar154;
    uVar193 = auVar154._0_8_;
    puVar1 = c + lVar200 + 0x19;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = auVar154._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar199;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = n[0x1a];
    auVar155 = auVar29 * auVar93 + auVar155;
    uVar193 = auVar155._0_8_;
    puVar1 = c + lVar200 + 0x1a;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = auVar155._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar199;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = n[0x1b];
    auVar156 = auVar30 * auVar94 + auVar156;
    uVar193 = auVar156._0_8_;
    puVar1 = c + lVar200 + 0x1b;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = auVar156._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar199;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = n[0x1c];
    auVar157 = auVar31 * auVar95 + auVar157;
    uVar193 = auVar157._0_8_;
    puVar1 = c + lVar200 + 0x1c;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = auVar157._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar199;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = n[0x1d];
    auVar158 = auVar32 * auVar96 + auVar158;
    uVar193 = auVar158._0_8_;
    puVar1 = c + lVar200 + 0x1d;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = auVar158._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar199;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = n[0x1e];
    auVar159 = auVar33 * auVar97 + auVar159;
    uVar193 = auVar159._0_8_;
    puVar1 = c + lVar200 + 0x1e;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = auVar159._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar199;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = n[0x1f];
    auVar160 = auVar34 * auVar98 + auVar160;
    uVar193 = auVar160._0_8_;
    puVar1 = c + lVar200 + 0x1f;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = auVar160._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar199;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = n[0x20];
    auVar161 = auVar35 * auVar99 + auVar161;
    uVar193 = auVar161._0_8_;
    puVar1 = c + lVar200 + 0x20;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = auVar161._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar199;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = n[0x21];
    auVar162 = auVar36 * auVar100 + auVar162;
    uVar193 = auVar162._0_8_;
    puVar1 = c + lVar200 + 0x21;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = auVar162._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar199;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = n[0x22];
    auVar163 = auVar37 * auVar101 + auVar163;
    uVar193 = auVar163._0_8_;
    puVar1 = c + lVar200 + 0x22;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = auVar163._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar199;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = n[0x23];
    auVar164 = auVar38 * auVar102 + auVar164;
    uVar193 = auVar164._0_8_;
    puVar1 = c + lVar200 + 0x23;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = auVar164._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar199;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = n[0x24];
    auVar165 = auVar39 * auVar103 + auVar165;
    uVar193 = auVar165._0_8_;
    puVar1 = c + lVar200 + 0x24;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = auVar165._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar199;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = n[0x25];
    auVar166 = auVar40 * auVar104 + auVar166;
    uVar193 = auVar166._0_8_;
    puVar1 = c + lVar200 + 0x25;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = auVar166._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar199;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = n[0x26];
    auVar167 = auVar41 * auVar105 + auVar167;
    uVar193 = auVar167._0_8_;
    puVar1 = c + lVar200 + 0x26;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = auVar167._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar199;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = n[0x27];
    auVar168 = auVar42 * auVar106 + auVar168;
    uVar193 = auVar168._0_8_;
    puVar1 = c + lVar200 + 0x27;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = auVar168._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar199;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = n[0x28];
    auVar169 = auVar43 * auVar107 + auVar169;
    uVar193 = auVar169._0_8_;
    puVar1 = c + lVar200 + 0x28;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = auVar169._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar199;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = n[0x29];
    auVar170 = auVar44 * auVar108 + auVar170;
    uVar193 = auVar170._0_8_;
    puVar1 = c + lVar200 + 0x29;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = auVar170._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar199;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = n[0x2a];
    auVar171 = auVar45 * auVar109 + auVar171;
    uVar193 = auVar171._0_8_;
    puVar1 = c + lVar200 + 0x2a;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = auVar171._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar199;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = n[0x2b];
    auVar172 = auVar46 * auVar110 + auVar172;
    uVar193 = auVar172._0_8_;
    puVar1 = c + lVar200 + 0x2b;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = auVar172._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar199;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = n[0x2c];
    auVar173 = auVar47 * auVar111 + auVar173;
    uVar193 = auVar173._0_8_;
    puVar1 = c + lVar200 + 0x2c;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar174._8_8_ = 0;
    auVar174._0_8_ = auVar173._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar199;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = n[0x2d];
    auVar174 = auVar48 * auVar112 + auVar174;
    uVar193 = auVar174._0_8_;
    puVar1 = c + lVar200 + 0x2d;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar175._8_8_ = 0;
    auVar175._0_8_ = auVar174._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar199;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = n[0x2e];
    auVar175 = auVar49 * auVar113 + auVar175;
    uVar193 = auVar175._0_8_;
    puVar1 = c + lVar200 + 0x2e;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar176._8_8_ = 0;
    auVar176._0_8_ = auVar175._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar199;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = n[0x2f];
    auVar176 = auVar50 * auVar114 + auVar176;
    uVar193 = auVar176._0_8_;
    puVar1 = c + lVar200 + 0x2f;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar177._8_8_ = 0;
    auVar177._0_8_ = auVar176._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uVar199;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = n[0x30];
    auVar177 = auVar51 * auVar115 + auVar177;
    uVar193 = auVar177._0_8_;
    puVar1 = c + lVar200 + 0x30;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar178._8_8_ = 0;
    auVar178._0_8_ = auVar177._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uVar199;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = n[0x31];
    auVar178 = auVar52 * auVar116 + auVar178;
    uVar193 = auVar178._0_8_;
    puVar1 = c + lVar200 + 0x31;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar179._8_8_ = 0;
    auVar179._0_8_ = auVar178._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uVar199;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = n[0x32];
    auVar179 = auVar53 * auVar117 + auVar179;
    uVar193 = auVar179._0_8_;
    puVar1 = c + lVar200 + 0x32;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar180._8_8_ = 0;
    auVar180._0_8_ = auVar179._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar54._8_8_ = 0;
    auVar54._0_8_ = uVar199;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = n[0x33];
    auVar180 = auVar54 * auVar118 + auVar180;
    uVar193 = auVar180._0_8_;
    puVar1 = c + lVar200 + 0x33;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar181._8_8_ = 0;
    auVar181._0_8_ = auVar180._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uVar199;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = n[0x34];
    auVar181 = auVar55 * auVar119 + auVar181;
    uVar193 = auVar181._0_8_;
    puVar1 = c + lVar200 + 0x34;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar182._8_8_ = 0;
    auVar182._0_8_ = auVar181._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar199;
    auVar120._8_8_ = 0;
    auVar120._0_8_ = n[0x35];
    auVar182 = auVar56 * auVar120 + auVar182;
    uVar193 = auVar182._0_8_;
    puVar1 = c + lVar200 + 0x35;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar183._8_8_ = 0;
    auVar183._0_8_ = auVar182._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar57._8_8_ = 0;
    auVar57._0_8_ = uVar199;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = n[0x36];
    auVar183 = auVar57 * auVar121 + auVar183;
    uVar193 = auVar183._0_8_;
    puVar1 = c + lVar200 + 0x36;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar184._8_8_ = 0;
    auVar184._0_8_ = auVar183._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar58._8_8_ = 0;
    auVar58._0_8_ = uVar199;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = n[0x37];
    auVar184 = auVar58 * auVar122 + auVar184;
    uVar193 = auVar184._0_8_;
    puVar1 = c + lVar200 + 0x37;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar185._8_8_ = 0;
    auVar185._0_8_ = auVar184._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uVar199;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = n[0x38];
    auVar185 = auVar59 * auVar123 + auVar185;
    uVar193 = auVar185._0_8_;
    puVar1 = c + lVar200 + 0x38;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar186._8_8_ = 0;
    auVar186._0_8_ = auVar185._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar199;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = n[0x39];
    auVar186 = auVar60 * auVar124 + auVar186;
    uVar193 = auVar186._0_8_;
    puVar1 = c + lVar200 + 0x39;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar187._8_8_ = 0;
    auVar187._0_8_ = auVar186._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar61._8_8_ = 0;
    auVar61._0_8_ = uVar199;
    auVar125._8_8_ = 0;
    auVar125._0_8_ = n[0x3a];
    auVar187 = auVar61 * auVar125 + auVar187;
    uVar193 = auVar187._0_8_;
    puVar1 = c + lVar200 + 0x3a;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar188._8_8_ = 0;
    auVar188._0_8_ = auVar187._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uVar199;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = n[0x3b];
    auVar188 = auVar62 * auVar126 + auVar188;
    uVar193 = auVar188._0_8_;
    puVar1 = c + lVar200 + 0x3b;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar189._8_8_ = 0;
    auVar189._0_8_ = auVar188._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar63._8_8_ = 0;
    auVar63._0_8_ = uVar199;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = n[0x3c];
    auVar189 = auVar63 * auVar127 + auVar189;
    uVar193 = auVar189._0_8_;
    puVar1 = c + lVar200 + 0x3c;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar190._8_8_ = 0;
    auVar190._0_8_ = auVar189._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar199;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = n[0x3d];
    auVar190 = auVar64 * auVar128 + auVar190;
    uVar193 = auVar190._0_8_;
    puVar1 = c + lVar200 + 0x3d;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar191._8_8_ = 0;
    auVar191._0_8_ = auVar190._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar199;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = n[0x3e];
    auVar191 = auVar65 * auVar129 + auVar191;
    uVar193 = auVar191._0_8_;
    puVar1 = c + lVar200 + 0x3e;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    auVar192._8_8_ = 0;
    auVar192._0_8_ = auVar191._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar199;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = n[0x3f];
    auVar192 = auVar66 * auVar130 + auVar192;
    uVar193 = auVar192._0_8_;
    puVar1 = c + lVar200 + 0x3f;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar193;
    uVar198 = auVar192._8_8_ + (ulong)CARRY8(uVar2,uVar193);
    puVar1 = c + 0x40 + lVar200;
    uVar2 = (ulong)bVar202;
    uVar193 = *puVar1 + uVar198;
    bVar202 = CARRY8(*puVar1,uVar198) || CARRY8(uVar193,uVar2);
    *puVar1 = uVar193 + uVar2;
    lVar200 = lVar200 + 1;
  } while (lVar200 != 0x40);
  memcpy(res,c + 0x40,0x200);
  lVar201 = 0;
  memset(local_228,0,0x200);
  Hacl_Bignum4096_sub(res,n,local_228);
  lVar200 = (ulong)bVar202 - 1;
  lVar196 = -(ulong)bVar202;
  auVar203._8_4_ = (int)lVar196;
  auVar203._0_8_ = lVar196;
  auVar203._12_4_ = (int)((ulong)lVar196 >> 0x20);
  auVar204._8_4_ = (int)lVar200;
  auVar204._0_8_ = lVar200;
  auVar204._12_4_ = (int)((ulong)lVar200 >> 0x20);
  do {
    *(undefined1 (*) [16])(res + lVar201) =
         *(undefined1 (*) [16])(res + lVar201) & auVar204 |
         *(undefined1 (*) [16])(local_228 + lVar201) & auVar203;
    lVar201 = lVar201 + 2;
  } while (lVar201 != 0x40);
  return;
}

Assistant:

static inline void areduction(uint32_t *n, uint32_t nInv, uint32_t *c, uint32_t *res)
{
  uint32_t c0 = 0U;
  KRML_MAYBE_FOR8(i0,
    0U,
    8U,
    1U,
    uint32_t qj = nInv * c[i0];
    uint32_t *res_j0 = c + i0;
    uint32_t c1 = 0U;
    KRML_MAYBE_FOR2(i,
      0U,
      2U,
      1U,
      uint32_t a_i = n[4U * i];
      uint32_t *res_i0 = res_j0 + 4U * i;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u32(a_i, qj, c1, res_i0);
      uint32_t a_i0 = n[4U * i + 1U];
      uint32_t *res_i1 = res_j0 + 4U * i + 1U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u32(a_i0, qj, c1, res_i1);
      uint32_t a_i1 = n[4U * i + 2U];
      uint32_t *res_i2 = res_j0 + 4U * i + 2U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u32(a_i1, qj, c1, res_i2);
      uint32_t a_i2 = n[4U * i + 3U];
      uint32_t *res_i = res_j0 + 4U * i + 3U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u32(a_i2, qj, c1, res_i););
    uint32_t r = c1;
    uint32_t c10 = r;
    uint32_t *resb = c + 8U + i0;
    uint32_t res_j = c[8U + i0];
    c0 = Lib_IntTypes_Intrinsics_add_carry_u32(c0, c10, res_j, resb););
  memcpy(res, c + 8U, 8U * sizeof (uint32_t));
  uint32_t c00 = c0;
  uint32_t tmp[8U] = { 0U };
  uint32_t c1 = Hacl_Bignum256_32_sub(res, n, tmp);
  KRML_MAYBE_UNUSED_VAR(c1);
  uint32_t m = 0U - c00;
  KRML_MAYBE_FOR8(i,
    0U,
    8U,
    1U,
    uint32_t *os = res;
    uint32_t x = (m & tmp[i]) | (~m & res[i]);
    os[i] = x;);
}